

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  bigit other_00;
  int iVar1;
  size_t sVar2;
  bigint *in_RSI;
  long in_RDI;
  int n;
  int j;
  int i;
  bigit borrow;
  int iVar3;
  int index;
  
  index = 0;
  other_00 = in_RSI->exp_ - *(int *)(in_RDI + 0xa0);
  iVar3 = 0;
  sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RSI);
  iVar1 = (int)sVar2;
  for (; iVar3 != iVar1; iVar3 = iVar3 + 1) {
    buffer<unsigned_int>::operator[]((buffer<unsigned_int> *)in_RSI,(long)iVar3);
    subtract_bigits(in_RSI,index,other_00,(bigit *)CONCAT44(iVar3,iVar1));
    other_00 = other_00 + 1;
  }
  while (index != 0) {
    subtract_bigits(in_RSI,index,other_00,(bigit *)CONCAT44(iVar3,iVar1));
  }
  remove_leading_zeros((bigint *)CONCAT44(iVar3,iVar1));
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (int j = 0, n = static_cast<int>(other.bigits_.size()); j != n;
         ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }